

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutNode.c
# Opt level: O0

int Cut_ManMappingArea_rec(Cut_Man_t *p,int Node)

{
  int iVar1;
  uint *puVar2;
  int local_30;
  int local_2c;
  int Counter;
  int i;
  Cut_Cut_t *pCut;
  int Node_local;
  Cut_Man_t *p_local;
  
  if (p->vCutsMax == (Vec_Ptr_t *)0x0) {
    p_local._4_4_ = 0;
  }
  else {
    puVar2 = (uint *)Vec_PtrEntry(p->vCutsMax,Node);
    if ((puVar2 == (uint *)0x0) || (*puVar2 >> 0x1c == 1)) {
      p_local._4_4_ = 0;
    }
    else {
      local_30 = 0;
      for (local_2c = 0; local_2c < (int)(*puVar2 >> 0x1c); local_2c = local_2c + 1) {
        iVar1 = Cut_ManMappingArea_rec(p,puVar2[(long)local_2c + 6]);
        local_30 = iVar1 + local_30;
      }
      Vec_PtrWriteEntry(p->vCutsMax,Node,(void *)0x0);
      p_local._4_4_ = local_30 + 1;
    }
  }
  return p_local._4_4_;
}

Assistant:

int Cut_ManMappingArea_rec( Cut_Man_t * p, int Node )
{
    Cut_Cut_t * pCut;
    int i, Counter;
    if ( p->vCutsMax == NULL )
        return 0;
    pCut = (Cut_Cut_t *)Vec_PtrEntry( p->vCutsMax, Node );
    if ( pCut == NULL || pCut->nLeaves == 1 )
        return 0;
    Counter = 0;
    for ( i = 0; i < (int)pCut->nLeaves; i++ )
        Counter += Cut_ManMappingArea_rec( p, pCut->pLeaves[i] );
    Vec_PtrWriteEntry( p->vCutsMax, Node, NULL );
    return 1 + Counter;
}